

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpi_dec_utils.c
# Opt level: O0

RK_S32 mpi_dec_opt_bufmode(void *ctx,char *next)

{
  char *pcVar1;
  MpiDecTestCmd *cmd;
  char *next_local;
  void *ctx_local;
  
  if (next == (char *)0x0) {
    _mpp_log_l(2,"mpi_dec_utils","invalid ext buf mode value\n",0);
    ctx_local._4_4_ = 0;
  }
  else {
    pcVar1 = strstr(next,"hi");
    if (pcVar1 == (char *)0x0) {
      pcVar1 = strstr(next,"i");
      if (pcVar1 == (char *)0x0) {
        pcVar1 = strstr(next,"e");
        if (pcVar1 == (char *)0x0) {
          *(undefined4 *)((long)ctx + 0x230) = 0;
        }
        else {
          *(undefined4 *)((long)ctx + 0x230) = 2;
        }
      }
      else {
        *(undefined4 *)((long)ctx + 0x230) = 1;
      }
    }
    else {
      *(undefined4 *)((long)ctx + 0x230) = 0;
    }
    ctx_local._4_4_ = 1;
  }
  return ctx_local._4_4_;
}

Assistant:

RK_S32 mpi_dec_opt_bufmode(void *ctx, const char *next)
{
    MpiDecTestCmd *cmd = (MpiDecTestCmd *)ctx;

    if (next) {
        if (strstr(next, "hi")) {
            cmd->buf_mode = MPP_DEC_BUF_HALF_INT;
        } else if (strstr(next, "i")) {
            cmd->buf_mode = MPP_DEC_BUF_INTERNAL;
        } else if (strstr(next, "e")) {
            cmd->buf_mode = MPP_DEC_BUF_EXTERNAL;
        } else {
            cmd->buf_mode = MPP_DEC_BUF_HALF_INT;
        }

        return 1;
    }

    mpp_err("invalid ext buf mode value\n");
    return 0;
}